

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toeplitz_plus_hankel_system_solver.h
# Opt level: O2

void __thiscall sptk::ToeplitzPlusHankelSystemSolver::Buffer::Buffer(Buffer *this)

{
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_0011a6c0;
  (this->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->p_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->p_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->p_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&this->ep_,2,&local_31);
  std::vector<double,_std::allocator<double>_>::vector(&this->g_,2,&local_32);
  std::vector<double,_std::allocator<double>_>::vector(&this->bar_,2,&local_33);
  std::vector<double,_std::allocator<double>_>::vector(&this->tmp_vector_,2,&local_34);
  Matrix2D::Matrix2D(&this->vx_);
  Matrix2D::Matrix2D(&this->ex_);
  Matrix2D::Matrix2D(&this->bx_);
  Matrix2D::Matrix2D(&this->inv_);
  Matrix2D::Matrix2D(&this->tau_);
  Matrix2D::Matrix2D(&this->tmp_matrix_);
  return;
}

Assistant:

Buffer() : ep_(2), g_(2), bar_(2), tmp_vector_(2) {
    }